

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O1

void __thiscall
NewClassExpression::NewClassExpression
          (NewClassExpression *this,ExpressionPtr *BaseClass,ExpressionPtr *Attributes)

{
  (this->super_TableBaseExpression).super_Expression._vptr_Expression =
       (_func_int **)&PTR_GetType_0012d040;
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  (this->m_BaseClass).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_BaseClass).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Attributes).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Attributes).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Elements).
  super__Vector_base<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Elements).
  super__Vector_base<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Elements).
  super__Vector_base<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_BaseClass).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (BaseClass->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_BaseClass).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(BaseClass->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  (this->m_Attributes).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Attributes->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Attributes).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(Attributes->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return;
}

Assistant:

explicit NewClassExpression( ExpressionPtr BaseClass, ExpressionPtr Attributes )
	{
		m_BaseClass = BaseClass;
		m_Attributes = Attributes;
	}